

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O3

void Disa::level_expansion<Disa::Adjacency_Subgraph>
               (Adjacency_Subgraph *graph,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *seeds,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_color)

{
  Adjacency_Graph<false> *this;
  __impl *p_Var1;
  pointer puVar2;
  _Elt_pointer puVar3;
  pointer pcVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Elt_pointer puVar9;
  _Map_pointer ppuVar10;
  _Elt_pointer puVar11;
  _Elt_pointer puVar12;
  _Map_pointer ppuVar13;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __result;
  source_location *psVar14;
  pointer puVar15;
  __normal_iterator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  _Var16;
  long lVar17;
  unsigned_long *puVar18;
  ostream *poVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  source_location *location;
  source_location *psVar22;
  unsigned_long *vertex;
  unsigned_long uVar23;
  pointer pqVar24;
  ulong uVar25;
  __impl *p_Var26;
  pointer pqVar27;
  unsigned_long uVar28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  bool bVar29;
  byte bVar30;
  span<const_unsigned_long,_18446744073709551615UL> sVar31;
  size_t front;
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  vertex_queues;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined *local_118;
  undefined8 uStack_110;
  Adjacency_Subgraph *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Elt_pointer local_d8;
  _Map_pointer ppuStack_d0;
  unsigned_long *local_c8;
  _Elt_pointer puStack_c0;
  _Elt_pointer local_b8;
  _Map_pointer ppuStack_b0;
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_a0;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  ulong local_40;
  undefined **local_38;
  
  bVar30 = 0;
  uVar25 = (long)(graph->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(graph->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_100 = graph;
  if ((uVar25 == 0) || (uVar25 < 9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_128 = &PTR_s__workspace_llm4binary_github_lic_001646c0;
    console_format_abi_cxx11_(&local_f8,(Disa *)0x0,(Log_Level)&local_128,in_RCX);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Graph is empty.",0xf);
    std::endl<char,std::char_traits<char>>(poVar19);
  }
  else {
    psVar14 = (source_location *)
              (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    location = (source_location *)
               (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (psVar14 == location) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_128 = &PTR_s__workspace_llm4binary_github_lic_001646d8;
      console_format_abi_cxx11_(&local_f8,(Disa *)0x0,(Log_Level)&local_128,location);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,local_f8._M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,"There are no seeds to begin expansion.",0x26);
      std::endl<char,std::char_traits<char>>(poVar19);
    }
    else {
      psVar22 = psVar14 + 1;
      if (psVar22 != location) {
        p_Var26 = psVar14->_M_impl;
        do {
          p_Var1 = psVar22->_M_impl;
          bVar29 = p_Var26 < p_Var1;
          if (p_Var26 <= p_Var1) {
            p_Var26 = p_Var1;
          }
          if (bVar29) {
            psVar14 = psVar22;
          }
          psVar22 = psVar22 + 1;
        } while (psVar22 != location);
      }
      p_Var26 = (__impl *)(((long)uVar25 >> 3) + -1);
      if (psVar14->_M_impl < p_Var26) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (vertex_color,(size_type)p_Var26);
        std::
        vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::vector(&local_a0,
                 (long)(seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_f8);
        puVar15 = (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar15 != puVar2) {
          memset(puVar15,0xff,((long)puVar2 + (-8 - (long)puVar15) & 0xfffffffffffffff8U) + 8);
        }
        puVar15 = (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        if ((seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar15) {
          uVar23 = 0;
          do {
            puVar18 = local_a0.
                      super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar23].c.
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (puVar18 ==
                local_a0.
                super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23].c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,std::allocator<unsigned_long>>::
              _M_push_back_aux<unsigned_long_const&>
                        ((deque<unsigned_long,std::allocator<unsigned_long>> *)
                         (local_a0.
                          super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar23),puVar15 + uVar23);
            }
            else {
              *puVar18 = puVar15[uVar23];
              *(unsigned_long **)
               ((deque<unsigned_long,std::allocator<unsigned_long>> *)
                (local_a0.
                 super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23) + 0x30) = puVar18 + 1;
            }
            puVar15 = (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start[puVar15[uVar23]] = uVar23;
            uVar23 = uVar23 + 1;
          } while (uVar23 < (ulong)((long)(seeds->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar15 >> 3));
        }
        this = &local_100->graph;
        uVar23 = 0;
        do {
          pqVar24 = local_a0.
                    super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          _Var16 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>>>>,__gnu_cxx::__ops::_Iter_pred<Disa::level_expansion<Disa::Adjacency_Subgraph>(Disa::Adjacency_Subgraph_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(auto:1_const&)_1_>>
                             (local_a0.
                              super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          if (_Var16._M_current == pqVar24) {
            std::
            vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~vector(&local_a0);
            return;
          }
          lVar17 = (long)local_a0.
                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a0.
                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar28 = uVar23;
          if (lVar17 != 0) {
            uVar25 = 0;
            local_48 = uVar23;
            do {
              pqVar24 = (pointer)((long)&local_a0.
                                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[~uVar25].c.
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Deque_impl_data._M_map + lVar17);
              if ((local_48 & 1) == 0) {
                pqVar24 = local_a0.
                          super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar25;
              }
              local_b8 = (_Elt_pointer)0x0;
              ppuStack_b0 = (_Map_pointer)0x0;
              local_c8 = (unsigned_long *)0x0;
              puStack_c0 = (_Elt_pointer)0x0;
              local_d8 = (_Elt_pointer)0x0;
              ppuStack_d0 = (_Map_pointer)0x0;
              local_f8.field_2._M_allocated_capacity = 0;
              local_f8.field_2._8_8_ = (_Elt_pointer)0x0;
              local_f8._M_dataplus._M_p = (pointer)0x0;
              local_f8._M_string_length = 0;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,0);
              local_40 = uVar25;
              while (ppuVar13 = ppuStack_b0, puVar12 = local_b8, puVar11 = puStack_c0,
                    puVar18 = local_c8, ppuVar10 = ppuStack_d0, puVar9 = local_d8,
                    uVar8 = local_f8.field_2._8_8_, uVar7 = local_f8.field_2._M_allocated_capacity,
                    sVar5 = local_f8._M_string_length, _Var6._M_p = local_f8._M_dataplus._M_p,
                    puVar3 = (pqVar24->c).
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur,
                    (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur != puVar3) {
                local_128 = (undefined **)*puVar3;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&pqVar24->c);
                sVar31 = Adjacency_Graph<false>::operator[](this,&local_128);
                puVar18 = sVar31._M_ptr;
                if (sVar31._M_extent._M_extent_value._M_extent_value != 0) {
                  lVar17 = sVar31._M_extent._M_extent_value._M_extent_value << 3;
                  do {
                    if ((vertex_color->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[*puVar18] == 0xffffffffffffffff) {
                      if (local_c8 == local_b8 + -1) {
                        std::deque<unsigned_long,std::allocator<unsigned_long>>::
                        _M_push_back_aux<unsigned_long_const&>
                                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,
                                   puVar18);
                      }
                      else {
                        *local_c8 = *puVar18;
                        local_c8 = local_c8 + 1;
                      }
                      puVar15 = (vertex_color->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar15[*puVar18] = puVar15[(long)local_128];
                    }
                    puVar18 = puVar18 + 1;
                    lVar17 = lVar17 + -8;
                  } while (lVar17 != 0);
                }
              }
              local_128 = (undefined **)local_f8._M_dataplus._M_p;
              pcVar4 = (pointer)local_128;
              uStack_120 = local_f8._M_string_length;
              local_f8._M_dataplus._M_p = (char *)0x0;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_allocated_capacity = 0;
              local_f8.field_2._8_8_ = 0;
              local_d8 = (_Elt_pointer)0x0;
              ppuStack_d0 = (_Map_pointer)0x0;
              local_c8 = (unsigned_long *)0x0;
              puStack_c0 = (_Elt_pointer)0x0;
              local_b8 = (_Elt_pointer)0x0;
              ppuStack_b0 = (_Map_pointer)0x0;
              pqVar27 = pqVar24;
              pbVar20 = &local_f8;
              for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pbVar20->_M_dataplus)._M_p =
                     (pointer)(pqVar27->c).
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_map;
                pqVar27 = (pointer)((long)pqVar27 + ((ulong)bVar30 * -2 + 1) * 8);
                pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)pbVar20 + (ulong)bVar30 * -0x10 + 8);
              }
              local_128._0_4_ = SUB84(_Var6._M_p,0);
              local_128._4_4_ = (undefined4)((ulong)_Var6._M_p >> 0x20);
              uStack_120._0_4_ = (undefined4)sVar5;
              uStack_120._4_4_ = (undefined4)(sVar5 >> 0x20);
              *(undefined4 *)
               &(pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_map = (undefined4)local_128;
              *(undefined4 *)
               ((long)&(pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Deque_impl_data._M_map + 4) = local_128._4_4_;
              *(undefined4 *)
               &(pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_map_size = (undefined4)uStack_120;
              *(undefined4 *)
               ((long)&(pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Deque_impl_data._M_map_size + 4) = uStack_120._4_4_;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)uVar7;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)uVar8;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = puVar9;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = ppuVar10;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar18;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = puVar11;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = puVar12;
              (pqVar24->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = ppuVar13;
              local_128 = (undefined **)pcVar4;
              uStack_120 = sVar5;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
              uVar25 = local_40 + 1;
              lVar17 = (long)local_a0.
                             super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a0.
                             super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar28 = local_48;
            } while (uVar25 < (ulong)((lVar17 >> 4) * -0x3333333333333333));
          }
          uVar23 = uVar28 + 1;
          psVar14 = (source_location *)
                    (local_100->graph).offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = (long)(local_100->graph).offset.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar14;
        } while ((lVar17 != 0) && (uVar28 < (lVar17 >> 3) - 1U));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_38 = &PTR_s__workspace_llm4binary_github_lic_00164708;
        console_format_abi_cxx11_(&local_f8,(Disa *)0x0,(Log_Level)&local_38,psVar14);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,
                             local_f8._M_string_length);
        std::__cxx11::to_string(&local_88,uVar23);
        std::operator+(&local_68,"Number of iterations have exceeded, ",&local_88);
        pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_68,". Is the graph disjoint?");
        local_128 = (undefined **)(pbVar20->_M_dataplus)._M_p;
        paVar21 = &pbVar20->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128 == paVar21) {
          local_118 = (undefined *)paVar21->_M_allocated_capacity;
          uStack_110 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          local_128 = &local_118;
        }
        else {
          local_118 = (undefined *)paVar21->_M_allocated_capacity;
        }
        uStack_120 = pbVar20->_M_string_length;
        (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar20->_M_string_length = 0;
        (pbVar20->field_2)._M_local_buf[0] = '\0';
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_128,uStack_120);
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_a0.
        super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&PTR_s__workspace_llm4binary_github_lic_001646f0;
        console_format_abi_cxx11_(&local_f8,(Disa *)0x0,(Log_Level)&local_a0,location);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,
                             local_f8._M_string_length);
        puVar15 = (local_100->graph).offset.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar2 = (local_100->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        if (puVar15 != puVar2) {
          uVar23 = ((long)puVar15 - (long)puVar2 >> 3) - 1;
        }
        std::__cxx11::to_string(&local_88,uVar23);
        std::operator+(&local_68,"A seed index is not in graph range [0, ",&local_88);
        pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_68,").");
        local_128 = (undefined **)(pbVar20->_M_dataplus)._M_p;
        paVar21 = &pbVar20->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128 == paVar21) {
          local_118 = (undefined *)paVar21->_M_allocated_capacity;
          uStack_110 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          local_128 = &local_118;
        }
        else {
          local_118 = (undefined *)paVar21->_M_allocated_capacity;
        }
        uStack_120 = pbVar20->_M_string_length;
        (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar20->_M_string_length = 0;
        (pbVar20->field_2)._M_local_buf[0] = '\0';
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_128,uStack_120);
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  std::__cxx11::string::~string((string *)&local_f8);
  exit(1);
}

Assistant:

void level_expansion(const _graph& graph, const std::vector<std::size_t>& seeds,
                     std::vector<std::size_t>& vertex_color) {
  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(!seeds.empty(), "There are no seeds to begin expansion.");
  ASSERT_DEBUG(*std::max_element(seeds.begin(), seeds.end()) < graph.size_vertex(),
               "A seed index is not in graph range [0, " + std::to_string(graph.size_vertex()) + ").");

  // Setup memory, and seed the queues and colors.
  vertex_color.resize(graph.size_vertex());
  std::vector<std::queue<std::size_t>> vertex_queues(seeds.size());
  FOR_EACH_REF(color, vertex_color) color = std::numeric_limits<std::size_t>::max();
  FOR(i_seed, seeds.size()) {
    vertex_queues[i_seed].push({seeds[i_seed]});
    vertex_color[seeds[i_seed]] = i_seed;
  }

  // Color vertices.
  std::size_t iteration = 0;
  while(std::any_of(vertex_queues.begin(), vertex_queues.end(), [](const auto& queue) { return !queue.empty(); })) {
    FOR(i_queue, vertex_queues.size()) {
      // ensures we do a forward's and backwards sweep to try and keep expansion 'unbiased'.
      auto& vertex_queue =
      iteration % 2 == 0 ? vertex_queues[i_queue] : vertex_queues[vertex_queues.size() - i_queue - 1];

      // Perform a level expansion for this color.
      std::queue<std::size_t> new_queue;
      while(!vertex_queue.empty()) {
        const std::size_t front = vertex_queue.front();
        vertex_queue.pop();
        FOR_EACH(vertex, graph[front]) {
          if(vertex_color[vertex] == std::numeric_limits<std::size_t>::max()) {
            new_queue.push(vertex);
            vertex_color[vertex] = vertex_color[front];
          }
        }
      }
      std::swap(new_queue, vertex_queue);
    }
    ASSERT(iteration++ < graph.size_vertex(),
           "Number of iterations have exceeded, " + std::to_string(iteration) + ". Is the graph disjoint?");
  }
}